

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailure.cpp
# Opt level: O3

void __thiscall
CheckFailure::CheckFailure
          (CheckFailure *this,UtestShell *test,char *fileName,size_t lineNumber,
          SimpleString *checkString,SimpleString *conditionString,SimpleString *text)

{
  SimpleString *this_00;
  
  TestFailure::TestFailure(&this->super_TestFailure,test,fileName,lineNumber);
  (this->super_TestFailure)._vptr_TestFailure = (_func_int **)&PTR__TestFailure_0012b940;
  TestFailure::createUserText((TestFailure *)&stack0xffffffffffffffd0,(SimpleString *)test);
  this_00 = &(this->super_TestFailure).message_;
  SimpleString::operator=(this_00,(SimpleString *)&stack0xffffffffffffffd0);
  SimpleString::~SimpleString((SimpleString *)&stack0xffffffffffffffd0);
  SimpleString::operator+=(this_00,checkString);
  SimpleString::operator+=(this_00,"(");
  SimpleString::operator+=(this_00,conditionString);
  SimpleString::operator+=(this_00,") failed");
  return;
}

Assistant:

CheckFailure::CheckFailure(UtestShell* test, const char* fileName, size_t lineNumber, const SimpleString& checkString, const SimpleString& conditionString, const SimpleString& text)
: TestFailure(test, fileName, lineNumber)
{
    message_ = createUserText(text);

    message_ += checkString;
    message_ += "(";
    message_ += conditionString;
    message_ += ") failed";
}